

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangleEstimators.h
# Opt level: O2

Estimates * CountExactTriangles(Estimates *__return_storage_ptr__,CGraph *cg)

{
  CGraph g;
  CGraph g_00;
  CGraph g_01;
  CGraph cg_relabel;
  CDAG dag;
  VertexIdx *in_stack_ffffffffffffff68;
  CGraph local_80;
  CDAG local_60;
  
  __return_storage_ptr__->fraction_of_vertices_seen = 1.0;
  __return_storage_ptr__->fraction_of_edges_seen = 1.0;
  __return_storage_ptr__->query_complexity = 1.0;
  Escape::CGraph::sortById(cg);
  Escape::CGraph::renameByDegreeOrder(&local_80,cg);
  Escape::CGraph::sortById(&local_80);
  degreeOrdered(&local_60,&local_80);
  Escape::CGraph::sortById(&local_60.outlist);
  betterWedgeEnumerator((TriangleInfo *)&stack0xffffffffffffff68,&local_60.outlist);
  __return_storage_ptr__->estimate = (double)(long)in_stack_ffffffffffffff68;
  g.nEdges = (EdgeIdx)local_60.inlist.offsets;
  g.nVertices = local_60.inlist.nEdges;
  g.offsets = local_60.inlist.nbors;
  g.nbors = in_stack_ffffffffffffff68;
  Escape::delCGraph(g);
  g_00.nEdges = (EdgeIdx)local_60.outlist.offsets;
  g_00.nVertices = local_60.outlist.nEdges;
  g_00.offsets = local_60.outlist.nbors;
  g_00.nbors = in_stack_ffffffffffffff68;
  Escape::delCGraph(g_00);
  g_01.nEdges = (EdgeIdx)local_80.offsets;
  g_01.nVertices = local_80.nEdges;
  g_01.offsets = local_80.nbors;
  g_01.nbors = in_stack_ffffffffffffff68;
  Escape::delCGraph(g_01);
  return __return_storage_ptr__;
}

Assistant:

Estimates CountExactTriangles (CGraph *cg)
{
//    printf ("Exactly counting the number of triangles...\n");

    Estimates output;
    cg->sortById();
    CGraph cg_relabel = cg->renameByDegreeOrder();
    cg_relabel.sortById();
    CDAG dag = degreeOrdered(&cg_relabel);
    (dag.outlist).sortById();

    //printf("Conversion comple. Going to count triangles now. \n");
    TriangleInfo info;
    info = betterWedgeEnumerator(&(dag.outlist));
    output.estimate = info.total;

    // Free up the memory
    delCGraph(dag.inlist);
    delCGraph(dag.outlist);
    delCGraph(cg_relabel);
    //printf ("  Triangle=%lld ",info.total);
    return output;
}